

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Axis.cpp
# Opt level: O3

Transform * __thiscall
iDynTree::Axis::getRotationTransform(Transform *__return_storage_ptr__,Axis *this,double theta)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  Position translationPosition;
  double dStack_f0;
  double dStack_d0;
  double dStack_70;
  Rotation local_68;
  
  Transform::Transform(__return_storage_ptr__);
  Rotation::RotAxis(&local_68,&this->direction,theta);
  Transform::setRotation(__return_storage_ptr__,&local_68);
  dVar11 = cos(theta);
  dVar12 = sin(theta);
  dVar1 = (this->direction).super_Vector3.m_data[2];
  dVar2 = (this->origin).super_Vector3.m_data[2];
  dVar11 = 1.0 - dVar11;
  auVar3 = *(undefined1 (*) [16])(this->direction).super_Vector3.m_data;
  dVar13 = auVar3._0_8_;
  dVar14 = auVar3._8_8_;
  dVar9 = (this->origin).super_Vector3.m_data[0];
  dVar10 = (this->origin).super_Vector3.m_data[1];
  auVar4._8_4_ = auVar3._0_4_;
  auVar4._0_8_ = dVar14;
  auVar4._12_4_ = auVar3._4_4_;
  dVar6 = dVar13 * dVar13;
  dVar7 = dVar14 * dVar14;
  auVar3._8_4_ = SUB84(dVar7,0);
  auVar3._0_8_ = dVar6;
  auVar3._12_4_ = (int)((ulong)dVar7 >> 0x20);
  auVar5._8_4_ = SUB84(dVar6,0);
  auVar5._0_8_ = dVar7;
  auVar5._12_4_ = (int)((ulong)dVar6 >> 0x20);
  Position::Position((Position *)&local_68);
  dStack_f0 = auVar5._8_8_;
  dStack_d0 = auVar4._8_8_;
  dVar8 = dVar11 * ((dVar1 * dVar1 + dStack_f0) * dVar10 -
                   (dVar1 * dVar2 + dVar9 * dStack_d0) * dVar14) +
          dVar12 * (dVar13 * dVar2 - dVar1 * dVar9);
  local_68.super_Matrix3x3.m_data[1]._0_4_ = SUB84(dVar8,0);
  local_68.super_Matrix3x3.m_data[0] =
       dVar11 * ((dVar1 * dVar1 + dVar7) * dVar9 - (dVar1 * dVar2 + dVar10 * dVar14) * dVar13) +
       dVar12 * (dVar1 * dVar10 - dVar14 * dVar2);
  local_68.super_Matrix3x3.m_data[1]._4_4_ = (int)((ulong)dVar8 >> 0x20);
  dStack_70 = auVar3._8_8_;
  local_68.super_Matrix3x3.m_data[2] =
       ((dStack_70 + dVar6) * dVar2 - (dVar9 * dVar13 + dVar14 * dVar10) * dVar1) * dVar11 +
       (dVar14 * dVar9 - dVar10 * dVar13) * dVar12;
  Transform::setPosition(__return_storage_ptr__,(Position *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

Transform Axis::getRotationTransform(const double theta) const
    {
        // Formula for rotation around and arbitrary axis given by
        // http://inside.mines.edu/fs_home/gmurray/ArbitraryAxisRotation/
        Transform nonRotated_T_rotated;

        // rotation
        nonRotated_T_rotated.setRotation(Rotation::RotAxis(this->getDirection(),theta));

        // translation
        double cost = cos(theta);
        double sint = sin(theta);
        double u   = this->getDirection()(0);
        double u2  = u*u;
        double v   = this->getDirection()(1);
        double v2  = v*v;
        double w   = this->getDirection()(2);
        double w2  = w*w;
        double a    = this->getOrigin()(0);
        double b    = this->getOrigin()(1);
        double c    = this->getOrigin()(2);

        Position translationPosition;
        translationPosition(0) =
            (a*(v2+w2) - u*(b*v+c*w))*(1-cost) + (b*w-c*v)*sint;
        translationPosition(1) =
            (b*(u2+w2) - v*(a*u+c*w))*(1-cost) + (c*u-a*w)*sint;
        translationPosition(2) =
            (c*(u2+v2) - w*(a*u+b*v))*(1-cost) + (a*v-b*u)*sint;

        nonRotated_T_rotated.setPosition(translationPosition);

        return nonRotated_T_rotated;
    }